

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test1.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  result *local_5e8;
  int local_5d4;
  duration<long,_std::ratio<1L,_1L>_> local_5d0;
  int *local_5c8;
  _Bind<void_(*(std::reference_wrapper<int>))(int_&)> local_5c0;
  function<void_()> local_5b0;
  function<void_()> local_590;
  int *local_570;
  _Bind<void_(*(std::reference_wrapper<int>))(int_&)> local_568;
  function<void_()> local_558;
  undefined1 local_538 [8];
  result res2;
  undefined1 local_4d0 [4];
  int x;
  int local_4ac;
  undefined1 local_4a8 [4];
  int i;
  result res [10];
  thread_pool local_d8 [8];
  thread_pool pool;
  
  nonstd::thread_pool::thread_pool(local_d8,0xe);
  nonstd::thread_pool::start();
  local_5e8 = (result *)local_4a8;
  do {
    nonstd::result::result(local_5e8);
    local_5e8 = local_5e8 + 1;
  } while (local_5e8 != (result *)&res[9].waitEnabled);
  for (local_4ac = 0; local_4ac < 10; local_4ac = local_4ac + 1) {
    std::function<void()>::function<void(&)(),void>((function<void()> *)local_4d0,doWork);
    nonstd::thread_pool::addJob
              (local_d8,(function<void()> *)local_4d0,local_4a8 + (long)local_4ac * 0x60);
    std::function<void_()>::~function((function<void_()> *)local_4d0);
  }
  res2._92_4_ = 10;
  nonstd::result::result((result *)local_538);
  local_570 = (int *)std::ref<int>((int *)&res2.field_0x5c);
  std::bind<void(&)(int&),std::reference_wrapper<int>>
            ((_func_void_int_ptr *)&local_568,(reference_wrapper<int> *)setNum);
  std::function<void()>::function<std::_Bind<void(*(std::reference_wrapper<int>))(int&)>,void>
            ((function<void()> *)&local_558,&local_568);
  nonstd::thread_pool::addJob(local_d8,&local_558,local_538);
  std::function<void_()>::~function(&local_558);
  nonstd::result::get();
  poVar1 = std::operator<<((ostream *)&std::cout,"x--. ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,res2._92_4_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::function<void()>::function<void(&)(),void>((function<void()> *)&local_590,doWork);
  nonstd::thread_pool::addJob(local_d8,&local_590);
  std::function<void_()>::~function(&local_590);
  local_5c8 = (int *)std::ref<int>((int *)&res2.field_0x5c);
  std::bind<void(&)(int&),std::reference_wrapper<int>>
            ((_func_void_int_ptr *)&local_5c0,(reference_wrapper<int> *)setNum);
  std::function<void()>::function<std::_Bind<void(*(std::reference_wrapper<int>))(int&)>,void>
            ((function<void()> *)&local_5b0,&local_5c0);
  nonstd::thread_pool::addJob(local_d8,&local_5b0);
  std::function<void_()>::~function(&local_5b0);
  do {
    poVar1 = std::operator<<((ostream *)&std::cout,"main loop");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_5d4 = 5;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1l>> *)&local_5d0,&local_5d4);
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>(&local_5d0);
    poVar1 = std::operator<<((ostream *)&std::cout,"x---> ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,res2._92_4_);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  } while( true );
}

Assistant:

int main()
{
   nonstd::thread_pool pool(14);
   pool.start();

   nonstd::result res[10];

   for (int i = 0; i < 10; ++i)
     pool.addJob(doWork, res[i]);

   int x = 10;
   nonstd::result res2;
   //waiting for one of thread.
   pool.addJob(std::bind(setNum, std::ref(x)), res2);
   res2.get();
   std::cout << "x--. " << x << std::endl;
   pool.addJob(doWork);
   pool.addJob(std::bind(setNum, std::ref(x)));

   while (1)
     {
        std::cout << "main loop" << std::endl;
        std::this_thread::sleep_for(std::chrono::seconds(5));
        std::cout << "x---> " << x << std::endl;
     }

   pool.stop();

   return 0;
}